

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

LPCWSTR __thiscall Js::ScopeVariablesGroupDisplay::Value(ScopeVariablesGroupDisplay *this,int radix)

{
  char16 c;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  Var pvVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  RecyclableObject *pRVar5;
  JavascriptFunction *this_01;
  FunctionBody *pFVar6;
  undefined4 extraout_var;
  char16 *pcVar7;
  FunctionInfo *this_02;
  undefined4 extraout_var_00;
  Var local_28;
  Var calleeFunc;
  Var value;
  
  bVar2 = VarIs<Js::ActivationObject>((this->super_RecyclableObjectDisplay).instance);
  if (bVar2) {
    pRVar5 = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectDisplay).instance);
    calleeFunc = (Var)0x0;
    if (((((pRVar5->type).ptr)->typeId == TypeIds_ActivationObject) &&
        (BVar3 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                           (pRVar5,pRVar5,0x1cf,&calleeFunc,
                            (this->super_RecyclableObjectDisplay).scriptContext), BVar3 != 0)) &&
       (bVar2 = VarIs<Js::RecyclableObject>(calleeFunc), bVar2)) {
      pRVar5 = VarTo<Js::RecyclableObject>(calleeFunc);
      local_28 = (Var)0x0;
      BVar3 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                        (pRVar5,pRVar5,0x1ce,&local_28,
                         (this->super_RecyclableObjectDisplay).scriptContext);
      if ((BVar3 != 0) && (bVar2 = VarIs<Js::JavascriptFunction>(local_28), bVar2)) {
        this_01 = VarTo<Js::JavascriptFunction>(local_28);
        pFVar6 = JavascriptFunction::GetFunctionBody(this_01);
        if (pFVar6 != (FunctionBody *)0x0) {
          iVar4 = (*(pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(pFVar6);
          pcVar7 = (char16 *)CONCAT44(extraout_var,iVar4);
          if (pcVar7 != (char16 *)0x0) {
            this_00 = ((this->super_RecyclableObjectDisplay).scriptContext)->threadContext->
                      debugManager->pCurrentInterpreterLocation->stringBuilder;
            this_00->length = 0;
            this_00->count = 0;
            this_00->firstChunk = (Data *)0x0;
            this_00->secondChunk = (Data *)0x0;
            this_00->lastChunk = (Data *)0x0;
            c = *pcVar7;
            while (c != L'\0') {
              pcVar7 = pcVar7 + 1;
              StringBuilder<Memory::ArenaAllocator>::Append(this_00,c);
              c = *pcVar7;
            }
            pcVar7 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
            return pcVar7;
          }
        }
      }
    }
  }
  else {
    pvVar1 = (this->super_RecyclableObjectDisplay).instance;
    Memory::Recycler::WBSetBit((char *)&calleeFunc);
    calleeFunc = pvVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((ScopeSlots *)&calleeFunc);
    bVar2 = ScopeSlots::IsDebuggerScopeSlotArray((ScopeSlots *)&calleeFunc);
    if (!bVar2) {
      this_02 = ScopeSlots::GetFunctionInfo((ScopeSlots *)&calleeFunc);
      pFVar6 = FunctionInfo::GetFunctionBody(this_02);
      iVar4 = (*(pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar6);
      return (LPCWSTR)CONCAT44(extraout_var_00,iVar4);
    }
  }
  return L"";
}

Assistant:

LPCWSTR ScopeVariablesGroupDisplay::Value(int radix)
    {
        if (VarIs<ActivationObject>(instance))
        {
            // The scope is defined by the activation object.
            Js::RecyclableObject *object = Js::VarTo<Js::RecyclableObject>(instance);
            try
            {
                // Trying to find out the JavascriptFunction from the scope.
                Var value = nullptr;
                if (object->GetTypeId() == TypeIds_ActivationObject && GetPropertyWithScriptEnter(object, object, PropertyIds::arguments, &value, scriptContext))
                {
                    if (Js::VarIs<Js::RecyclableObject>(value))
                    {
                        Js::RecyclableObject *argObject = Js::VarTo<Js::RecyclableObject>(value);
                        Var calleeFunc = nullptr;
                        if (GetPropertyWithScriptEnter(argObject, argObject, PropertyIds::callee, &calleeFunc, scriptContext) && Js::VarIs<Js::JavascriptFunction>(calleeFunc))
                        {
                            Js::JavascriptFunction *calleeFunction = Js::VarTo<Js::JavascriptFunction>(calleeFunc);
                            Js::FunctionBody *pFuncBody = calleeFunction->GetFunctionBody();

                            if (pFuncBody)
                            {
                                const char16* pDisplayName = pFuncBody->GetDisplayName();
                                if (pDisplayName)
                                {
                                    StringBuilder<ArenaAllocator>* builder = GetStringBuilder();
                                    builder->Reset();
                                    builder->AppendSz(pDisplayName);
                                    return builder->Detach();
                                }
                            }
                        }
                    }
                }
            }
            catch(const JavascriptException& err)
            {
                err.GetAndClear();  // discard exception object
            }

            return _u("");
        }
        else
        {
            // The scope is defined by a slot array object so grab the function body out to get the function name.
            ScopeSlots slotArray = ScopeSlots(reinterpret_cast<Field(Var)*>(instance));

            if(slotArray.IsDebuggerScopeSlotArray())
            {
                // handling for block/catch scope
                return _u("");
            }
            else
            {
                Js::FunctionBody *functionBody = slotArray.GetFunctionInfo()->GetFunctionBody();
                return functionBody->GetDisplayName();
            }
        }
    }